

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidator.cpp
# Opt level: O1

Result * CoreML::validateSchemaTypesIsMultiArray
                   (Result *__return_storage_ptr__,FeatureDescription *featureDesc,
                   ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,int shapeSizeMin,
                   int shapeSizeMax)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  size_t sVar4;
  long *plVar5;
  char *pcVar6;
  undefined1 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream out;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  puVar7 = (undefined1 *)featureDesc->type_;
  if ((FeatureType *)puVar7 == (FeatureType *)0x0) {
    puVar7 = Specification::_FeatureType_default_instance_;
  }
  if (((FeatureType *)puVar7)->_oneof_case_[0] == 5) {
    if (((((FeatureType *)puVar7)->Type_).multiarraytype_)->datatype_ != allowedArrayFeatureDataType
       ) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unsupported array type \"",0x18)
      ;
      if (((FeatureType *)puVar7)->_oneof_case_[0] == 5) {
        puVar7 = (undefined1 *)(((FeatureType *)puVar7)->Type_).multiarraytype_;
      }
      else {
        puVar7 = Specification::_ArrayFeatureType_default_instance_;
      }
      iVar1 = ((ArrayFeatureType *)puVar7)->datatype_;
      if (iVar1 < 0x10020) {
        if (iVar1 == 0) {
          pcVar6 = "INVALID";
        }
        else {
          pcVar6 = "MLArrayDataTypeFLOAT16";
        }
      }
      else if (iVar1 == 0x20020) {
        pcVar6 = "MLArrayDataTypeINT32";
      }
      else if (iVar1 == 0x10040) {
        pcVar6 = "MLArrayDataTypeDOUBLE";
      }
      else {
        pcVar6 = "MLArrayDataTypeFLOAT32";
      }
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\" for feature \"",0xf);
      plVar5 = (long *)((ulong)(featureDesc->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      lVar2 = *plVar5;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,lVar2,plVar5[1] + lVar2);
      std::__cxx11::string::append((char *)&local_1d8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Should be of: ",0xe);
      if (allowedArrayFeatureDataType < ArrayFeatureType_ArrayDataType_FLOAT32) {
        if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
          pcVar6 = "INVALID";
        }
        else {
          pcVar6 = "MLArrayDataTypeFLOAT16";
        }
      }
      else if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_INT32) {
        pcVar6 = "MLArrayDataTypeINT32";
      }
      else if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_DOUBLE) {
        pcVar6 = "MLArrayDataTypeDOUBLE";
      }
      else {
        pcVar6 = "MLArrayDataTypeFLOAT32";
      }
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1d8);
      goto LAB_002ff3d1;
    }
    iVar1 = (((((FeatureType *)puVar7)->Type_).multiarraytype_)->shape_).current_size_;
    if (shapeSizeMin <= iVar1 && iVar1 <= shapeSizeMax) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unsupported array rank ",0x17);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," should be in range [",0x15);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,shapeSizeMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,shapeSizeMax);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_002ff3e7;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unsupported type \"",0x12);
    puVar7 = (undefined1 *)featureDesc->type_;
    if ((FeatureType *)puVar7 == (FeatureType *)0x0) {
      puVar7 = Specification::_FeatureType_default_instance_;
    }
    if ((ulong)((FeatureType *)puVar7)->_oneof_case_[0] < 9) {
      pcVar6 = &DAT_003dab7c +
               *(int *)(&DAT_003dab7c + (ulong)((FeatureType *)puVar7)->_oneof_case_[0] * 4);
    }
    else {
      pcVar6 = "INVALID";
    }
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\" for feature \"",0xf);
    plVar5 = (long *)((ulong)(featureDesc->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    lVar2 = *plVar5;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,lVar2,plVar5[1] + lVar2);
    std::__cxx11::string::append((char *)&local_1d8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Should be of: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"MLFeatureTypeType_multiArrayType",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," with data type of: ",0x14);
    if (allowedArrayFeatureDataType < ArrayFeatureType_ArrayDataType_FLOAT32) {
      if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
        pcVar6 = "INVALID";
      }
      else {
        pcVar6 = "MLArrayDataTypeFLOAT16";
      }
    }
    else if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_INT32) {
      pcVar6 = "MLArrayDataTypeINT32";
    }
    else if (allowedArrayFeatureDataType == ArrayFeatureType_ArrayDataType_DOUBLE) {
      pcVar6 = "MLArrayDataTypeDOUBLE";
    }
    else {
      pcVar6 = "MLArrayDataTypeFLOAT32";
    }
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1d8);
LAB_002ff3d1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_002ff3e7;
  }
  operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
LAB_002ff3e7:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateSchemaTypesIsMultiArray(const Specification::FeatureDescription& featureDesc,
                                           Specification::ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,
                                           int shapeSizeMin = 1,
                                           int shapeSizeMax = INT_MAX) {
        // Check the types
        auto& type = featureDesc.type();
        if (!type.has_multiarraytype() || type.Type_case() != Specification::FeatureType::kMultiArrayType) {
            // Invalid type
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(featureDesc.type().Type_case()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::FeatureType::kMultiArrayType))
            << " with data type of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        if (type.multiarraytype().datatype() != allowedArrayFeatureDataType) {
            std::stringstream out;
            out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(type.multiarraytype().datatype()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        int shapeSize = type.multiarraytype().shape_size();
        if (shapeSize<shapeSizeMin || shapeSizeMax < shapeSize) {
            std::stringstream out;
            out << "Unsupported array rank " << shapeSize
            << " should be in range [" << shapeSizeMin << "," << shapeSizeMax << "]"
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        // no invariant broken -- type matches one of the allowed types
        return Result();
    }